

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# uspoof.cpp
# Opt level: O1

int32_t uspoof_check2UnicodeString_63
                  (USpoofChecker *sc,UnicodeString *id,USpoofCheckResult *checkResult,
                  UErrorCode *status)

{
  int32_t iVar1;
  SpoofImpl *This;
  CheckResult *checkResult_00;
  CheckResult stackCheckResult;
  CheckResult CStack_98;
  
  This = icu_63::SpoofImpl::validateThis(sc,status);
  iVar1 = 0;
  if (This != (SpoofImpl *)0x0) {
    if (checkResult == (USpoofCheckResult *)0x0) {
      icu_63::CheckResult::CheckResult(&CStack_98);
      iVar1 = checkImpl_63(This,id,&CStack_98,status);
      icu_63::CheckResult::~CheckResult(&CStack_98);
    }
    else {
      checkResult_00 = icu_63::CheckResult::validateThis(checkResult,status);
      iVar1 = 0;
      if (checkResult_00 != (CheckResult *)0x0) {
        iVar1 = checkImpl_63(This,id,checkResult_00,status);
        return iVar1;
      }
    }
  }
  return iVar1;
}

Assistant:

U_CAPI int32_t U_EXPORT2
uspoof_check2UnicodeString(const USpoofChecker *sc,
                          const icu::UnicodeString &id,
                          USpoofCheckResult* checkResult,
                          UErrorCode *status) {
    const SpoofImpl *This = SpoofImpl::validateThis(sc, *status);
    if (This == NULL) {
        return FALSE;
    }

    if (checkResult != NULL) {
        CheckResult* ThisCheckResult = CheckResult::validateThis(checkResult, *status);
        if (ThisCheckResult == NULL) {
            return FALSE;
        }
        return checkImpl(This, id, ThisCheckResult, status);
    } else {
        // Stack-allocate the checkResult since this method doesn't return it
        CheckResult stackCheckResult;
        return checkImpl(This, id, &stackCheckResult, status);
    }
}